

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O3

vector<gpu::Device,_std::allocator<gpu::Device>_> *
gpu::selectDevices(vector<gpu::Device,_std::allocator<gpu::Device>_> *__return_storage_ptr__,
                  uint mask,bool silent)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  Device *this;
  vector<gpu::Device,_std::allocator<gpu::Device>_> devices;
  vector<gpu::Device,_std::allocator<gpu::Device>_> local_48;
  
  if (mask == 0) {
    (__return_storage_ptr__->super__Vector_base<gpu::Device,_std::allocator<gpu::Device>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<gpu::Device,_std::allocator<gpu::Device>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<gpu::Device,_std::allocator<gpu::Device>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    enumDevices();
    (__return_storage_ptr__->super__Vector_base<gpu::Device,_std::allocator<gpu::Device>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<gpu::Device,_std::allocator<gpu::Device>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<gpu::Device,_std::allocator<gpu::Device>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (local_48.super__Vector_base<gpu::Device,_std::allocator<gpu::Device>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_48.super__Vector_base<gpu::Device,_std::allocator<gpu::Device>_>._M_impl.
        super__Vector_impl_data._M_start) {
      lVar2 = 0;
      uVar3 = 0;
      do {
        if ((mask >> ((uint)uVar3 & 0x1f) & 1) != 0) {
          this = (Device *)
                 ((long)&((local_48.super__Vector_base<gpu::Device,_std::allocator<gpu::Device>_>.
                           _M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p + lVar2
                 );
          if (!silent) {
            bVar1 = Device::printInfo(this);
            if (!bVar1) goto LAB_0012544b;
          }
          std::vector<gpu::Device,_std::allocator<gpu::Device>_>::push_back
                    (__return_storage_ptr__,this);
        }
LAB_0012544b:
        uVar3 = uVar3 + 1;
        lVar2 = lVar2 + 0x90;
      } while (uVar3 < (ulong)(((long)local_48.
                                      super__Vector_base<gpu::Device,_std::allocator<gpu::Device>_>.
                                      _M_impl.super__Vector_impl_data._M_finish -
                                (long)local_48.
                                      super__Vector_base<gpu::Device,_std::allocator<gpu::Device>_>.
                                      _M_impl.super__Vector_impl_data._M_start >> 4) *
                              -0x71c71c71c71c71c7));
    }
    std::vector<gpu::Device,_std::allocator<gpu::Device>_>::~vector(&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Device> selectDevices(unsigned int mask, bool silent)
{
	if (!mask)
		return std::vector<Device>();

	std::vector<Device> devices = enumDevices();

	std::vector<Device> res;
	for (size_t k = 0; k < devices.size(); k++) {
		if (!(mask & (1 << k)))
			continue;

		Device &device = devices[k];
		if (!silent)
			if (!device.printInfo())
				continue;

		res.push_back(device);
	}

	return res;
}